

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrapper.cpp
# Opt level: O2

void * operator_new__(size_t sz,nothrow_t *param_2)

{
  bool bVar1;
  ThreadLocalAllocationBuffer<15,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getSizeClass,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getClassSize,_1024UL,_16777216UL,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_262144U,_Hoard::HoardHeapType>
  *this;
  char *pcVar2;
  char *pcVar3;
  
  bVar1 = isCustomHeapInitialized();
  if (bVar1) {
    this = &getCustomHeap()->
            super_ThreadLocalAllocationBuffer<15,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getSizeClass,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getClassSize,_1024UL,_16777216UL,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_262144U,_Hoard::HoardHeapType>
    ;
    pcVar2 = (char *)Hoard::
                     ThreadLocalAllocationBuffer<15,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getSizeClass,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getClassSize,_1024UL,_16777216UL,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_262144U,_Hoard::HoardHeapType>
                     ::malloc(this,sz);
    pcVar3 = initBufferPtr;
    if (pcVar2 == (char *)0x0) {
      fwrite("INTERNAL FAILURE.\n",0x12,1,_stderr);
      abort();
    }
  }
  else {
    pcVar3 = initBufferPtr + sz;
    if (&xxmalloc::initialized < pcVar3) {
      initBufferPtr = pcVar3;
      abort();
    }
    pcVar2 = initBufferPtr;
    if (xxmalloc::initialized == '\0') {
      xxmalloc::initialized = '\x01';
    }
  }
  initBufferPtr = pcVar3;
  return pcVar2;
}

Assistant:

void * FLATTEN operator new[] (size_t sz, const std::nothrow_t&)
  throw()
 {
  return xxmalloc(sz);
}